

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

bool SetGenericProperty<float>
               (map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                *list,char *szName,float *value)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  uint32_t hash;
  pair<unsigned_int,_float> local_28;
  
  if (szName != (char *)0x0) {
    hash = SuperFastHash(szName,0,0);
    iVar2 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
            ::find(&list->_M_t,&hash);
    p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
      local_28.first = hash;
      local_28.second = *value;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,float>,std::_Select1st<std::pair<unsigned_int_const,float>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,float>>>
      ::_M_emplace_unique<std::pair<unsigned_int,float>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,float>,std::_Select1st<std::pair<unsigned_int_const,float>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,float>>>
                  *)list,&local_28);
    }
    else {
      *(float *)&iVar2._M_node[1].field_0x4 = *value;
    }
    return (_Rb_tree_header *)iVar2._M_node != p_Var1;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/GenericProperty.h"
                ,0x3e,
                "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = float]"
               );
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}